

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::EncryptionWithColumnKey::write
          (EncryptionWithColumnKey *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  const_iterator _iter133;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  uint32_t in_stack_ffffffffffffff68;
  TType in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38 [4];
  uint local_14;
  undefined8 local_10;
  EncryptionWithColumnKey *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_14 = 0;
  local_8 = this;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&this->path_in_schema);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  local_14 = uVar2 + local_14;
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(local_38);
  local_38[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(local_38);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeString
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_14 = uVar2 + local_14;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_38);
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListEnd((TProtocol *)0x225666c);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2256693);
  local_14 = uVar2 + local_14;
  if (((byte)this->__isset & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeBinary
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2256732);
    local_14 = uVar2 + local_14;
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x2256757);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x225677e);
  uVar3 = uVar2 + local_14;
  local_14 = uVar3;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x22567aa);
  return (ulong)uVar3;
}

Assistant:

uint32_t EncryptionWithColumnKey::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("EncryptionWithColumnKey");

  xfer += oprot->writeFieldBegin("path_in_schema", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRING, static_cast<uint32_t>(this->path_in_schema.size()));
    duckdb::vector<std::string> ::const_iterator _iter133;
    for (_iter133 = this->path_in_schema.begin(); _iter133 != this->path_in_schema.end(); ++_iter133)
    {
      xfer += oprot->writeString((*_iter133));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  if (this->__isset.key_metadata) {
    xfer += oprot->writeFieldBegin("key_metadata", ::apache::thrift::protocol::T_STRING, 2);
    xfer += oprot->writeBinary(this->key_metadata);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}